

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.h
# Opt level: O2

void tommy_list_foreach(tommy_list *list,tommy_foreach_func *func)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  tommy_list ptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = *list;
  while (ptVar3 != (tommy_list)0x0) {
    ptVar2 = ptVar3->next;
    free(ptVar3->data);
    ptVar3 = ptVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_list_foreach(tommy_list* list, tommy_foreach_func* func)
{
	tommy_node* node = tommy_list_head(list);

	while (node) {
		void* data = node->data;
		node = node->next;
		func(data);
	}
}